

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.hpp
# Opt level: O2

void __thiscall
boost::unit_test::framework::setup_error::setup_error(setup_error *this,const_string *m)

{
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,m->m_begin,m->m_end);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  *(undefined ***)this = &PTR__runtime_error_001e0550;
  return;
}

Assistant:

struct BOOST_TEST_DECL setup_error : public std::runtime_error {
    setup_error( const_string m ) : std::runtime_error( std::string( m.begin(), m.size() ) ) {}
}